

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_unsigned_integer.h
# Opt level: O3

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,unsigned_char,2u,2u,date::optional_t<date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>>&,date::character_t<char>&,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>&>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               unsigned_integer_t<unsigned_char,_2U,_2U> *fmt,
               optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>
               *others,character_t<char> *others_1,
               cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
               *others_2)

{
  bool bVar1;
  bool bVar2;
  value_type_conflict1 vVar3;
  
  vVar3 = '\0';
  bVar2 = true;
  while ((end->m_position != pos->m_position &&
         (0xf5 < (byte)(pos->m_cache[pos->m_position] - 0x3aU)))) {
    vVar3 = vVar3 * '\n' + pos->m_cache[pos->m_position] + 0xd0;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
    bVar1 = !bVar2;
    bVar2 = false;
    if (bVar1) {
      *fmt->value = vVar3;
      bVar2 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>&,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>&>
                        (pos,end,others,others_1,others_2);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, unsigned_integer_t<UnsignedInt, MinLength, MaxLength>& fmt, Others&&... others)
{
    using char_type  = typename iterator_traits<Iterator>::value_type;

    auto x = UnsignedInt{ 0 };
    auto count = std::size_t{ 0 };
    while (count < MaxLength)
    {
        if (pos == end)
            break;

        const char_type ch = *pos;
        if ((ch < char_type{ '0' }) || (ch > char_type{ '9' }))
            break;

        x = 10 * x + static_cast<UnsignedInt>(ch - char_type{ '0' });
        ++count;
        ++pos;
    }

    if (count < MinLength)
        return false;

    fmt.value = x;
    return read_impl(pos, end, std::forward<Others>(others)...);
}